

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O1

void prngSTBStepR(void *buf,size_t count,void *state)

{
  ushort uVar1;
  prng_stb_st *s;
  size_t sVar2;
  
  if (count != 0) {
    sVar2 = 0;
    do {
      uVar1 = *(ushort *)((long)state + 0x4a);
      _prngSTBClock((prng_stb_st *)state);
      *(char *)((long)buf + sVar2) = (char)(uVar1 / 0xff) + *(char *)((long)state + 0x4a);
      sVar2 = sVar2 + 1;
    } while (count != sVar2);
  }
  return;
}

Assistant:

void prngSTBStepR(void* buf, size_t count, void* state)
{
	register u16 u;
	prng_stb_st* s = (prng_stb_st*)state;
	// pre
	ASSERT(memIsValid(s, sizeof(prng_stb_st)));
	ASSERT(memIsValid(buf, count));
	// генерировать
	while (count--)
	{
		u = s->u;
		_prngSTBClock(s);
		*((octet*)buf) = (s->u) + u / 255;
		buf = (octet*)buf + 1;
	}
	u = 0;
}